

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Var * __thiscall wabt::Var::operator=(Var *this,Var *rhs)

{
  size_t sVar1;
  char *pcVar2;
  undefined8 uVar3;
  string_view name;
  
  sVar1 = (rhs->loc).filename._M_len;
  pcVar2 = (rhs->loc).filename._M_str;
  uVar3 = *(undefined8 *)((long)&(rhs->loc).field_1 + 8);
  (this->loc).field_1.field_1.offset = (rhs->loc).field_1.field_1.offset;
  *(undefined8 *)((long)&(this->loc).field_1 + 8) = uVar3;
  (this->loc).filename._M_len = sVar1;
  (this->loc).filename._M_str = pcVar2;
  if (rhs->type_ == Index) {
    set_index(this,(rhs->field_2).index_);
  }
  else {
    name._M_str = (rhs->field_2).name_._M_dataplus._M_p;
    name._M_len = (rhs->field_2).name_._M_string_length;
    set_name(this,name);
  }
  return this;
}

Assistant:

Var& Var::operator=(const Var& rhs) {
  loc = rhs.loc;
  if (rhs.is_index()) {
    set_index(rhs.index_);
  } else {
    set_name(rhs.name_);
  }
  return *this;
}